

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O0

void __thiscall undo::UndoHistory::undo(UndoHistory *this)

{
  bool bVar1;
  UndoHistory *this_local;
  
  if (this->m_cur == (UndoState *)0x0) {
    __assert_fail("m_cur",
                  "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/undo_history.cpp",
                  0x2d,"void undo::UndoHistory::undo()");
  }
  if (this->m_cur != (UndoState *)0x0) {
    if (((this->m_cur == this->m_first) || (bVar1 = true, this->m_cur->m_prev == (UndoState *)0x0))
       && (bVar1 = false, this->m_cur == this->m_first)) {
      bVar1 = this->m_cur->m_prev == (UndoState *)0x0;
    }
    if (!bVar1) {
      __assert_fail("(m_cur != m_first && m_cur->m_prev) || (m_cur == m_first && !m_cur->m_prev)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/undo_history.cpp"
                    ,0x33,"void undo::UndoHistory::undo()");
    }
    moveTo(this,this->m_cur->m_prev);
  }
  return;
}

Assistant:

void UndoHistory::undo()
{
  assert(m_cur);
  if (!m_cur)
    return;

  assert(
    (m_cur != m_first && m_cur->m_prev) ||
    (m_cur == m_first && !m_cur->m_prev));

  moveTo(m_cur->m_prev);
}